

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::verify
          (BufferCopyFromBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ulong *puVar1;
  deUint32 dVar2;
  long extraout_RAX;
  long lVar3;
  ulong uVar4;
  Random rng;
  deRandom local_30;
  
  deRandom_init(&local_30,this->m_seed);
  lVar3 = extraout_RAX;
  if (this->m_bufferSize != 0) {
    uVar4 = 0;
    do {
      dVar2 = deRandom_getUint32(&local_30);
      *(char *)(*(long *)(ctx + 0x18) + uVar4) = (char)dVar2;
      lVar3 = *(long *)(ctx + 0x30);
      puVar1 = (ulong *)(lVar3 + (uVar4 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->m_bufferSize);
  }
  return (int)lVar3;
}

Assistant:

void BufferCopyFromBuffer::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	(context.getReference());
	de::Random			rng			(m_seed);

	for (size_t ndx = 0; ndx < (size_t)m_bufferSize; ndx++)
		reference.set(ndx, rng.getUint8());
}